

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall SFFile::TranslatePercussionPresetZone(SFFile *this,SFPreset *preset,SFBag *pzone)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  SFInst *pSVar5;
  SFBag *pSVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  SFPreset **ppSVar10;
  SFPerc *pSVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  byte bVar15;
  SFPerc perc;
  SFPreset *local_a0;
  anon_union_2_2_c2a07933_for_SFGenComposite_0 local_98;
  byte local_96;
  byte local_95;
  undefined2 local_94;
  byte local_32;
  
  bVar15 = 0;
  bVar2 = (pzone->KeyRange).Lo;
  if (bVar2 <= (pzone->KeyRange).Hi) {
    uVar9 = (uint)bVar2;
    do {
      pSVar5 = this->Instruments;
      lVar7 = (long)pzone->Target;
      uVar4 = pSVar5[lVar7].BagIndex;
      uVar12 = (ulong)uVar4;
      if (uVar4 < pSVar5[lVar7 + 1].BagIndex) {
        lVar13 = (ulong)((uint)uVar4 * 4) * 3;
        do {
          pSVar6 = this->InstrBags;
          if ((((-1 < *(int *)((long)&pSVar6->Target + lVar13)) &&
               ((&(pSVar6->KeyRange).Lo)[lVar13] <= uVar9)) &&
              (uVar9 <= (&(pSVar6->KeyRange).Hi)[lVar13])) &&
             ((bVar2 = (pzone->VelRange).Hi, (&(pSVar6->VelRange).Lo)[lVar13] <= bVar2 &&
              (bVar3 = (pzone->VelRange).Lo, bVar3 <= (&(pSVar6->VelRange).Hi)[lVar13])))) {
            local_32 = preset->field_0x15 & 0x7f;
            local_a0 = preset;
            memcpy(&local_98,&DefaultGenerators,0x66);
            if ((char)pSVar5[lVar7].field_0x15 < '\0') {
              SetInstrumentGenerators
                        (this,(SFGenComposite *)&local_98.keyRange,
                         (uint)pSVar6[pSVar5[lVar7].BagIndex].GenIndex,
                         (uint)pSVar6[(ulong)pSVar5[lVar7].BagIndex + 1].GenIndex);
            }
            SetInstrumentGenerators
                      (this,(SFGenComposite *)&local_98.keyRange,
                       (uint)*(ushort *)((long)&pSVar6->GenIndex + lVar13),
                       (uint)*(ushort *)((long)&pSVar6[1].GenIndex + lVar13));
            AddPresetGenerators(this,(SFGenComposite *)&local_98.keyRange,(uint)pzone->GenIndex,
                                (uint)pzone[1].GenIndex,preset);
            local_98.keyRange.Lo = (BYTE)preset->Program;
            local_98.keyRange.Hi = (BYTE)uVar9;
            local_96 = (byte)*(undefined4 *)(&(pSVar6->VelRange).Lo + lVar13);
            if (local_96 < bVar3) {
              local_96 = bVar3;
            }
            local_95 = (&(pSVar6->VelRange).Hi)[lVar13];
            if (bVar2 < local_95) {
              local_95 = bVar2;
            }
            local_94 = *(undefined2 *)((long)&pSVar6->Target + lVar13);
            TArray<SFPerc,_SFPerc>::Grow(&this->Percussion,1);
            ppSVar10 = &local_a0;
            pSVar11 = (this->Percussion).Array + (this->Percussion).Count;
            for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
              pSVar11->Preset = *ppSVar10;
              ppSVar10 = ppSVar10 + (ulong)bVar15 * -2 + 1;
              pSVar11 = (SFPerc *)((long)pSVar11 + ((ulong)bVar15 * -2 + 1) * 8);
            }
            puVar1 = &(this->Percussion).Count;
            *puVar1 = *puVar1 + 1;
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0xc;
        } while (uVar12 < pSVar5[lVar7 + 1].BagIndex);
      }
      bVar14 = uVar9 < (pzone->KeyRange).Hi;
      uVar9 = uVar9 + 1;
    } while (bVar14);
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPresetZone(SFPreset *preset, SFBag *pzone)
{
	int key, i;

	for (key = pzone->KeyRange.Lo; key <= pzone->KeyRange.Hi; ++key)
	{
		SFInst *inst = &Instruments[pzone->Target];
		for (i = inst->BagIndex; i < (inst + 1)->BagIndex; ++i)
		{
			if (InstrBags[i].Target < 0)
			{ // This instrument zone has no sample.
				continue;
			}
			if (InstrBags[i].KeyRange.Lo > key || InstrBags[i].KeyRange.Hi < key)
			{ // This instrument zone does not contain the key we want.
				continue;
			}
			if (InstrBags[i].VelRange.Lo > pzone->VelRange.Hi ||
				InstrBags[i].VelRange.Hi < pzone->VelRange.Lo)
			{ // This instrument zone does not intersect the current velocity range.
				continue;
			}
			// An intersection! Add the composite generator for this key and velocity range.
			SFPerc perc;
			perc.LoadOrder = preset->LoadOrder;
			perc.Preset = preset;
			perc.Generators = DefaultGenerators;
			if (inst->bHasGlobalZone)
			{
				SetInstrumentGenerators(&perc.Generators, InstrBags[inst->BagIndex].GenIndex, InstrBags[inst->BagIndex + 1].GenIndex);
			}
			SetInstrumentGenerators(&perc.Generators, InstrBags[i].GenIndex, InstrBags[i + 1].GenIndex);
			AddPresetGenerators(&perc.Generators, pzone->GenIndex, (pzone + 1)->GenIndex, preset);
			perc.Generators.drumset = (BYTE)preset->Program;
			perc.Generators.key = key;
			perc.Generators.velRange.Lo = MAX(pzone->VelRange.Lo, InstrBags[i].VelRange.Lo);
			perc.Generators.velRange.Hi = MIN(pzone->VelRange.Hi, InstrBags[i].VelRange.Hi);
			perc.Generators.sampleID = InstrBags[i].Target;
			Percussion.Push(perc);
		}
	}
}